

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzline.cpp
# Opt level: O2

void pztopology::TPZLine::MapToSide<double>
               (int side,TPZVec<double> *InternalPar,TPZVec<double> *SidePar,
               TPZFMatrix<double> *JacToSide)

{
  int iVar1;
  TPZTransform<double> Transf;
  TPZTransform<double> TransfR;
  
  SideToSideTransform(&TransfR,2,side);
  TPZTransform<double>::TPZTransform(&Transf);
  TPZTransform<double>::CopyFrom(&Transf,&TransfR);
  iVar1 = SideDimension(side);
  (*SidePar->_vptr_TPZVec[3])(SidePar,(long)iVar1);
  TPZTransform<double>::Apply(&Transf,InternalPar,SidePar);
  TPZFMatrix<double>::operator=(JacToSide,&Transf.fMult.super_TPZFMatrix<double>);
  TPZTransform<double>::~TPZTransform(&Transf);
  TPZTransform<double>::~TPZTransform(&TransfR);
  return;
}

Assistant:

void TPZLine::MapToSide(int side, TPZVec<T> &InternalPar, TPZVec<T> &SidePar, TPZFMatrix<T> &JacToSide) {
		TPZTransform<> TransfR = SideToSideTransform(NSides - 1, side);
        TPZTransform<T> Transf;
        Transf.CopyFrom(TransfR);
		SidePar.Resize(SideDimension(side));
		Transf.Apply(InternalPar,SidePar);
		
		JacToSide = Transf.Mult();
	}